

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O2

void __thiscall
Js::WebAssemblyEnvironment::CalculateOffsets
          (WebAssemblyEnvironment *this,WebAssemblyTable *table,WebAssemblyMemory *memory)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint uVar6;
  WasmElementSegment *pWVar7;
  ArrayBufferBase *pAVar8;
  WasmDataSegment *this_00;
  WebAssemblyModule *pWVar9;
  uint32 iSeg;
  uint elementsIndex;
  ulong uVar10;
  WasmNode local_78;
  undefined1 local_50 [8];
  anon_class_16_2_a175977a outOfRangeError;
  undefined4 *puStack_38;
  int32 hCode;
  
  this->offsetInitialized = true;
  pWVar9 = (this->module).ptr;
  local_50 = (undefined1  [8])
             (((((pWVar9->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if ((table == (WebAssemblyTable *)0x0) || (memory == (WebAssemblyMemory *)0x0)) {
    JavascriptError::ThrowTypeError((ScriptContext *)local_50,-0x7ff5ec71,(PCWSTR)0x0);
  }
  outOfRangeError.scriptContext = (ScriptContext *)((long)&outOfRangeError.hCode + 4);
  outOfRangeError.hCode._4_4_ = 0x800a1b67;
  for (uVar10 = 0; uVar10 < pWVar9->m_elementsegCount; uVar10 = uVar10 + 1) {
    pWVar7 = WebAssemblyModule::GetElementSeg(pWVar9,(uint32)uVar10);
    local_78.op = (pWVar7->m_offsetExpr).op;
    local_78._2_6_ = *(undefined6 *)&(pWVar7->m_offsetExpr).field_0x2;
    local_78.field_1.block = (pWVar7->m_offsetExpr).field_1.block;
    local_78.field_1.brTable.targetTable = (pWVar7->m_offsetExpr).field_1.brTable.targetTable;
    local_78.field_1._16_8_ = *(undefined8 *)((long)&(pWVar7->m_offsetExpr).field_1 + 0x10);
    uVar3 = WebAssemblyModule::GetOffsetFromInit((this->module).ptr,&local_78,this);
    uVar4 = UInt32Math::
            Add<Js::WebAssemblyEnvironment::CalculateOffsets(Js::WebAssemblyTable*,Js::WebAssemblyMemory*)::__0>
                      (uVar3,pWVar7->m_numElem,(anon_class_16_2_a175977a *)local_50);
    uVar5 = WebAssemblyTable::GetCurrentLength(table);
    if (uVar5 < uVar4) goto LAB_00c17bb6;
    this->elementSegmentOffsets[uVar10] = uVar3;
    pWVar9 = (this->module).ptr;
  }
  pAVar8 = WebAssemblyMemory::GetBuffer(memory);
  if (pAVar8->isDetached == false) {
    puStack_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puStack_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puStack_38 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xd7,"(!buffer->IsDetached())","!buffer->IsDetached()");
    if (!bVar2) {
LAB_00c17bbf:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puStack_38 = 0;
  }
  outOfRangeError.hCode._4_4_ = 0x800a1b5c;
  uVar10 = 0;
  do {
    pWVar9 = (this->module).ptr;
    if (pWVar9->m_datasegCount <= uVar10) {
      return;
    }
    this_00 = WebAssemblyModule::GetDataSeg(pWVar9,(uint32)uVar10);
    if (this_00 == (WasmDataSegment *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puStack_38 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                  ,0xdc,"(segment != nullptr)","segment != nullptr");
      if (!bVar2) goto LAB_00c17bbf;
      *puStack_38 = 0;
    }
    local_78.op = (this_00->m_initExpr).op;
    local_78._2_6_ = *(undefined6 *)&(this_00->m_initExpr).field_0x2;
    local_78.field_1.block = (this_00->m_initExpr).field_1.block;
    local_78.field_1.brTable.targetTable = (this_00->m_initExpr).field_1.brTable.targetTable;
    local_78.field_1._16_8_ = *(undefined8 *)((long)&(this_00->m_initExpr).field_1 + 0x10);
    uVar3 = WebAssemblyModule::GetOffsetFromInit((this->module).ptr,&local_78,this);
    uVar4 = Wasm::WasmDataSegment::GetSourceSize(this_00);
    uVar4 = UInt32Math::
            Add<Js::WebAssemblyEnvironment::CalculateOffsets(Js::WebAssemblyTable*,Js::WebAssemblyMemory*)::__0>
                      (uVar3,uVar4,(anon_class_16_2_a175977a *)local_50);
    uVar6 = (*(pAVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar8);
    if (uVar6 < uVar4) {
LAB_00c17bb6:
      CalculateOffsets::anon_class_16_2_a175977a::operator()((anon_class_16_2_a175977a *)local_50);
    }
    this->dataSegmentOffsets[uVar10] = uVar3;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void WebAssemblyEnvironment::CalculateOffsets(WebAssemblyTable* table, WebAssemblyMemory* memory)
{
    DebugOnly(offsetInitialized = true);
    ScriptContext* scriptContext = module->GetScriptContext();
    if (!table || !memory)
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
    }

    int32 hCode = WASMERR_ElementSegOutOfRange;
    auto outOfRangeError = [scriptContext, &hCode] { JavascriptError::ThrowWebAssemblyLinkError(scriptContext, hCode); };

    for (uint elementsIndex = 0; elementsIndex < module->GetElementSegCount(); ++elementsIndex)
    {
        Wasm::WasmElementSegment* eSeg = module->GetElementSeg(elementsIndex);
        uint offset = module->GetOffsetFromInit(eSeg->GetOffsetExpr(), this);
        if (UInt32Math::Add(offset, eSeg->GetNumElements(), outOfRangeError) > table->GetCurrentLength())
        {
            outOfRangeError();
        }
        this->elementSegmentOffsets[elementsIndex] = offset;
    }

    ArrayBufferBase* buffer = memory->GetBuffer();
    Assert(!buffer->IsDetached());
    hCode = WASMERR_DataSegOutOfRange;
    for (uint32 iSeg = 0; iSeg < module->GetDataSegCount(); ++iSeg)
    {
        Wasm::WasmDataSegment* segment = module->GetDataSeg(iSeg);
        Assert(segment != nullptr);
        const uint32 offset = module->GetOffsetFromInit(segment->GetOffsetExpr(), this);
        const uint32 size = segment->GetSourceSize();

        if (UInt32Math::Add(offset, size, outOfRangeError) > buffer->GetByteLength())
        {
            outOfRangeError();
        }
        this->dataSegmentOffsets[iSeg] = offset;
    }
}